

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds00_reverse.cpp
# Opt level: O0

void reverse(vector<int,_std::allocator<int>_> *v,int a,int b)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_24;
  iterator iStack_20;
  int i;
  iterator beg;
  int b_local;
  int a_local;
  vector<int,_std::allocator<int>_> *v_local;
  
  beg._M_current._0_4_ = b;
  beg._M_current._4_4_ = a;
  iStack_20 = std::vector<int,_std::allocator<int>_>::begin(v);
  for (local_24 = beg._M_current._4_4_;
      local_24 < (beg._M_current._4_4_ + (int)beg._M_current) / 2 + 1; local_24 = local_24 + 1) {
    local_30 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&stack0xffffffffffffffe0,(long)local_24);
    local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&stack0xffffffffffffffe0,(long)beg._M_current._4_4_);
    local_40 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&local_48,(long)(int)beg._M_current);
    local_38 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator-(&local_40,1);
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_30,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_38)
    ;
  }
  return;
}

Assistant:

void reverse(vector<int> &v, int a, int b) {
    // write your code only in this function
    auto beg = v.begin();
    for (int i = a; i < (a + b) / 2 + 1; i++) {
        iter_swap(beg + i, beg + a + b - 1);
    }
}